

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rational.hpp
# Opt level: O2

void __thiscall
scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::Rational
          (Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *this,double x)

{
  BigInt<unsigned_int,_unsigned_long> *this_00;
  uint64_t x_00;
  uint uVar1;
  BigInt<unsigned_int,_unsigned_long> *this_01;
  BigInt<unsigned_int,_unsigned_long> local_50;
  
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::Frac
            (&this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>);
  (this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._vptr_Frac =
       (_func_int **)&PTR__Frac_00110bd0;
  BigInt<unsigned_int,_unsigned_long>::BigInt(&local_50,0x10000000000000);
  this_00 = &(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._q;
  BigInt<unsigned_int,_unsigned_long>::operator=(this_00,&local_50);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  BigInt<unsigned_int,_unsigned_long>::BigInt
            (&local_50,((ulong)x & 0xfffffffffffff) + 0x10000000000000);
  uVar1 = (uint)((ulong)x >> 0x34) & 0x7ff;
  this_01 = &(this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>)._p;
  BigInt<unsigned_int,_unsigned_long>::operator=(this_01,&local_50);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
  if (uVar1 < 0x3ff) {
    x_00 = 0x3ff - (ulong)uVar1;
    this_01 = this_00;
  }
  else {
    if (uVar1 == 0x3ff) goto LAB_00103d62;
    x_00 = (ulong)uVar1 - 0x3ff;
  }
  BigInt<unsigned_int,_unsigned_long>::operator<<=(this_01,x_00);
LAB_00103d62:
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::_simplify
            (&this->super_Frac<scp::BigInt<unsigned_int,_unsigned_long>_>);
  return;
}

Assistant:

constexpr Rational<TInteger>::Rational(double x) : Frac<TInteger>()
	{
		const uint64_t raw = *reinterpret_cast<uint64_t*>(&x);

		constexpr uint64_t signFilter = 0x8000000000000000;
		constexpr uint64_t exponentFilter = 0x7FF0000000000000;
		constexpr uint8_t exponentShift = 52;
		constexpr uint64_t mantissaFilter = 0x000FFFFFFFFFFFFF;
		constexpr uint64_t mantissaDivisor = 0x0010000000000000;

		bool negative = (raw & signFilter) != 0;
		uint64_t exponent = (raw & exponentFilter) >> exponentShift;
		uint64_t mantissa = (raw & mantissaFilter);

		_q = mantissaDivisor;
		_p = mantissaDivisor + mantissa;

		if (exponent < 1023)
		{
			_q <<= 1023 - exponent;
		}
		else if (exponent > 1023)
		{
			_p <<= exponent - 1023;
		}

		_simplify();
	}